

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

RectMatrix<double,_3U,_3U> * __thiscall
OpenMD::RectMatrix<double,_3U,_3U>::operator=
          (RectMatrix<double,_3U,_3U> *this,RectMatrix<double,_3U,_3U> *m)

{
  RectMatrix<double,_3U,_3U> *pRVar1;
  uint i;
  long lVar2;
  long lVar3;
  
  pRVar1 = this;
  if (this != m) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        (*(double (*) [3])*(double (*) [3])this)[lVar3] =
             (*(double (*) [3])*(double (*) [3])m)[lVar3];
      }
      m = (RectMatrix<double,_3U,_3U> *)((long)m + 0x18);
      this = (RectMatrix<double,_3U,_3U> *)((long)this + 0x18);
    }
  }
  return pRVar1;
}

Assistant:

RectMatrix<Real, Row, Col>& operator=(const RectMatrix<Real, Row, Col>& m) {
      if (this == &m) return *this;

      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }